

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_int8.h
# Opt level: O0

void ncnn::transpose_pack_A_tile_int8(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 *puVar4;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int kk_3;
  char *p0_3;
  int kk_2;
  char *p0_2;
  int kk_1;
  char *p0_1;
  __m128i _p;
  __m128i _pp;
  __m128i _p1;
  __m128i _p0;
  int kk;
  char *p0;
  int ii;
  char *pp;
  int A_hstep;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  undefined8 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int iVar5;
  Mat *in_stack_fffffffffffffe50;
  int local_1a4;
  undefined1 *local_1a0;
  ulong local_188;
  ulong uStack_180;
  int local_154;
  ulong *local_150;
  int local_144;
  ulong *local_140;
  
  iVar3 = cpu_support_x86_avx_vnni_int8();
  if (iVar3 == 0) {
    iVar3 = cpu_support_x86_avx_vnni();
    if (iVar3 == 0) {
      iVar3 = *(int *)((long)in_RDI + 0x2c);
      local_140 = (ulong *)*in_RSI;
      for (local_144 = 0; local_144 + 7 < in_ECX; local_144 = local_144 + 8) {
        local_150 = (ulong *)(*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D *
                                        in_RDI[2] + (long)(in_EDX + local_144));
        for (local_154 = 0; local_154 + 1 < in_R9D; local_154 = local_154 + 2) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *local_150;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)local_150 + (long)iVar3);
          auVar1 = vpunpcklbw_avx(auVar2,auVar1);
          local_188 = auVar1._0_8_;
          uStack_180 = auVar1._8_8_;
          *local_140 = local_188;
          local_140[1] = uStack_180;
          local_140 = local_140 + 2;
          local_150 = (ulong *)((long)local_150 + (long)(iVar3 << 1));
        }
        for (; local_154 < in_R9D; local_154 = local_154 + 1) {
          *local_140 = *local_150;
          local_140 = local_140 + 1;
          local_150 = (ulong *)((long)local_150 + (long)iVar3);
        }
      }
      for (; local_144 + 3 < in_ECX; local_144 = local_144 + 4) {
        local_1a0 = (undefined1 *)
                    (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2] +
                    (long)(in_EDX + local_144));
        for (local_1a4 = 0; local_1a4 + 1 < in_R9D; local_1a4 = local_1a4 + 2) {
          *(undefined1 *)local_140 = *local_1a0;
          *(undefined1 *)((long)local_140 + 1) = local_1a0[iVar3];
          *(undefined1 *)((long)local_140 + 2) = local_1a0[1];
          *(undefined1 *)((long)local_140 + 3) = local_1a0[iVar3 + 1];
          *(undefined1 *)((long)local_140 + 4) = local_1a0[2];
          *(undefined1 *)((long)local_140 + 5) = local_1a0[iVar3 + 2];
          *(undefined1 *)((long)local_140 + 6) = local_1a0[3];
          *(undefined1 *)((long)local_140 + 7) = local_1a0[iVar3 + 3];
          local_140 = local_140 + 1;
          local_1a0 = local_1a0 + (iVar3 << 1);
        }
        for (; local_1a4 < in_R9D; local_1a4 = local_1a4 + 1) {
          *(undefined1 *)local_140 = *local_1a0;
          *(undefined1 *)((long)local_140 + 1) = local_1a0[1];
          *(undefined1 *)((long)local_140 + 2) = local_1a0[2];
          *(undefined1 *)((long)local_140 + 3) = local_1a0[3];
          local_140 = (ulong *)((long)local_140 + 4);
          local_1a0 = local_1a0 + iVar3;
        }
      }
      for (; local_144 + 1 < in_ECX; local_144 = local_144 + 2) {
        puVar4 = (undefined1 *)
                 (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2] +
                 (long)(in_EDX + local_144));
        for (iVar5 = 0; iVar5 + 1 < in_R9D; iVar5 = iVar5 + 2) {
          *(undefined1 *)local_140 = *puVar4;
          *(undefined1 *)((long)local_140 + 1) = puVar4[iVar3];
          *(undefined1 *)((long)local_140 + 2) = puVar4[1];
          *(undefined1 *)((long)local_140 + 3) = puVar4[iVar3 + 1];
          local_140 = (ulong *)((long)local_140 + 4);
          puVar4 = puVar4 + (iVar3 << 1);
        }
        for (; iVar5 < in_R9D; iVar5 = iVar5 + 1) {
          *(undefined1 *)local_140 = *puVar4;
          *(undefined1 *)((long)local_140 + 1) = puVar4[1];
          local_140 = (ulong *)((long)local_140 + 2);
          puVar4 = puVar4 + iVar3;
        }
      }
      for (; local_144 < in_ECX; local_144 = local_144 + 1) {
        puVar4 = (undefined1 *)
                 (*in_RDI + (long)*(int *)((long)in_RDI + 0x2c) * (long)in_R8D * in_RDI[2] +
                 (long)(in_EDX + local_144));
        for (iVar5 = 0; iVar5 < in_R9D; iVar5 = iVar5 + 1) {
          *(undefined1 *)local_140 = *puVar4;
          local_140 = (ulong *)((long)local_140 + 1);
          puVar4 = puVar4 + iVar3;
        }
      }
    }
    else {
      transpose_pack_A_tile_int8_avxvnni
                (in_stack_fffffffffffffe50,
                 (Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),(int)in_stack_fffffffffffffe40,
                 in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    }
  }
  else {
    transpose_pack_A_tile_int8_avxvnniint8
              (in_stack_fffffffffffffe50,
               (Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),(int)in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile_int8(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        transpose_pack_A_tile_int8_avx512vnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNIINT8 && __AVX__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni_int8())
    {
        transpose_pack_A_tile_int8_avxvnniint8(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        transpose_pack_A_tile_int8_avxvnni(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__ && !__AVXVNNI__ && !__AVXVNNIINT8__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx2())
    {
        transpose_pack_A_tile_int8_avx2(A, AT, i, max_ii, k, max_kk);
        return;
    }
#endif

    // NCNN_LOGE("transpose_pack_A_tile_int8");
    // assert A.elempack == 1
    // assert A.dims == 2

    const int A_hstep = A.w;

    signed char* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        const signed char* p0 = A.row<const signed char>(k) + (i + ii);

        int kk = 0;
#if __AVX512VNNI__
        __m512i _w_shift = _mm512_setzero_si512();
        __m512i _v127 = _mm512_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadu_si128((const __m128i*)p0);
            __m128i _p1 = _mm_loadu_si128((const __m128i*)(p0 + A_hstep));
            __m128i _p2 = _mm_loadu_si128((const __m128i*)(p0 + A_hstep * 2));
            __m128i _p3 = _mm_loadu_si128((const __m128i*)(p0 + A_hstep * 3));
            transpose16x4_epi8(_p0, _p1, _p2, _p3);
            __m512i _pp = combine4x4_epi32(_p0, _p1, _p2, _p3);
            _w_shift = _mm512_dpbusd_epi32(_w_shift, _v127, _pp);
            _mm512_storeu_si512((__m512i*)pp, _pp);
            pp += 64;
            p0 += A_hstep * 4;
        }
        if (max_kk >= 4)
        {
            _mm512_storeu_si512((__m512i*)pp, _w_shift);
            pp += 64;
        }
#endif // __AVX512VNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p0 = _mm_loadu_si128((const __m128i*)p0);
            __m128i _p1 = _mm_loadu_si128((const __m128i*)(p0 + A_hstep));
            __m128i _t0 = _mm_unpacklo_epi8(_p0, _p1);
            __m128i _t1 = _mm_unpackhi_epi8(_p0, _p1);
            _mm_store_si128((__m128i*)pp, _t0);
            _mm_store_si128((__m128i*)(pp + 16), _t1);
            pp += 32;
            p0 += A_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm_loadu_si128((const __m128i*)p0);
            _mm_store_si128((__m128i*)pp, _p);
            pp += 16;
            p0 += A_hstep;
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        const signed char* p0 = A.row<const signed char>(k) + (i + ii);

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep));
            __m128i _p2 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep * 2));
            __m128i _p3 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep * 3));
            transpose8x4_epi8(_p0, _p1, _p2, _p3);
            __m256i _pp = combine4x2_epi32(_p0, _p1);
            _mm256_storeu_si256((__m256i*)pp, _pp);
            pp += 32;
            p0 += A_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        __m256i _w_shift = _mm256_setzero_si256();
        __m256i _v127 = _mm256_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep));
            __m128i _p2 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep * 2));
            __m128i _p3 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep * 3));
            transpose8x4_epi8(_p0, _p1, _p2, _p3);
            __m256i _pp = combine4x2_epi32(_p0, _p1);
            _w_shift = _mm256_comp_dpbusd_epi32(_w_shift, _v127, _pp);
            _mm256_storeu_si256((__m256i*)pp, _pp);
            pp += 32;
            p0 += A_hstep * 4;
        }
        if (max_kk >= 4)
        {
            _mm256_storeu_si256((__m256i*)pp, _w_shift);
            pp += 32;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            __m128i _p0 = _mm_loadl_epi64((const __m128i*)p0);
            __m128i _p1 = _mm_loadl_epi64((const __m128i*)(p0 + A_hstep));
            __m128i _pp = _mm_unpacklo_epi8(_p0, _p1);
#if __AVX512F__
            _mm_store_si128((__m128i*)pp, _pp);
#else
            _mm_storeu_si128((__m128i*)pp, _pp);
#endif
            pp += 16;
            p0 += A_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            __m128i _p = _mm_loadl_epi64((const __m128i*)p0);
            _mm_storel_epi64((__m128i*)pp, _p);
            pp += 8;
            p0 += A_hstep;
        }
    }
#endif // __AVX2__
    for (; ii + 3 < max_ii; ii += 4)
    {
        const signed char* p0 = A.row<const signed char>(k) + (i + ii);

#if __AVX512VNNI__ || __AVXVNNI__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(A_hstep));
#endif // __AVX512VNNI__ || __AVXVNNI__

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _pp = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            __m128i _si = _mm_setr_epi8(0, 4, 8, 12, 1, 5, 9, 13, 2, 6, 10, 14, 3, 7, 11, 15);
            _pp = _mm_shuffle_epi8(_pp, _si);
            _mm_storeu_si128((__m128i*)pp, _pp);
            pp += 16;
            p0 += A_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        __m128i _w_shift = _mm_setzero_si128();
        __m128i _v127 = _mm_set1_epi8(127);
        for (; kk + 3 < max_kk; kk += 4)
        {
            __m128i _pp = _mm_i32gather_epi32((const int*)p0, _vindex, sizeof(signed char));
            __m128i _si = _mm_setr_epi8(0, 4, 8, 12, 1, 5, 9, 13, 2, 6, 10, 14, 3, 7, 11, 15);
            _pp = _mm_shuffle_epi8(_pp, _si);
            _w_shift = _mm_comp_dpbusd_epi32(_w_shift, _v127, _pp);
            _mm_storeu_si128((__m128i*)pp, _pp);
            pp += 16;
            p0 += A_hstep * 4;
        }
        if (max_kk >= 4)
        {
            _mm_storeu_si128((__m128i*)pp, _w_shift);
            pp += 16;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[1];
            pp[3] = p0[A_hstep + 1];
            pp[4] = p0[2];
            pp[5] = p0[A_hstep + 2];
            pp[6] = p0[3];
            pp[7] = p0[A_hstep + 3];
            pp += 8;
            p0 += A_hstep * 2;
        }
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp[2] = p0[2];
            pp[3] = p0[3];
            pp += 4;
            p0 += A_hstep;
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        const signed char* p0 = A.row<const signed char>(k) + (i + ii);

        int kk = 0;
#if __SSE2__
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[A_hstep * 2];
            pp[3] = p0[A_hstep * 3];
            pp[4] = p0[1];
            pp[5] = p0[A_hstep + 1];
            pp[6] = p0[A_hstep * 2 + 1];
            pp[7] = p0[A_hstep * 3 + 1];
            pp += 8;
            p0 += A_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift0 = 0;
        int w_shift1 = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[A_hstep * 2];
            pp[3] = p0[A_hstep * 3];
            pp[4] = p0[1];
            pp[5] = p0[A_hstep + 1];
            pp[6] = p0[A_hstep * 2 + 1];
            pp[7] = p0[A_hstep * 3 + 1];
            w_shift0 += pp[0];
            w_shift0 += pp[1];
            w_shift0 += pp[2];
            w_shift0 += pp[3];
            w_shift1 += pp[4];
            w_shift1 += pp[5];
            w_shift1 += pp[6];
            w_shift1 += pp[7];
            pp += 8;
            p0 += A_hstep * 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift0 * 127;
            ((int*)pp)[1] = w_shift1 * 127;
            pp += 8;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk + 1 < max_kk; kk += 2)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[1];
            pp[3] = p0[A_hstep + 1];
            pp += 4;
            p0 += A_hstep * 2;
        }
#endif // __SSE2__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp[1] = p0[1];
            pp += 2;
            p0 += A_hstep;
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        const signed char* p0 = A.row<const signed char>(k) + (i + ii);

        int kk = 0;
#if __AVX512VNNI__ || __AVXVNNI__
#if __AVXVNNIINT8__
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[A_hstep * 2];
            pp[3] = p0[A_hstep * 3];
            pp += 4;
            p0 += A_hstep * 4;
        }
#else  // __AVXVNNIINT8__
        int w_shift = 0;
        for (; kk + 3 < max_kk; kk += 4)
        {
            pp[0] = p0[0];
            pp[1] = p0[A_hstep];
            pp[2] = p0[A_hstep * 2];
            pp[3] = p0[A_hstep * 3];
            w_shift += pp[0];
            w_shift += pp[1];
            w_shift += pp[2];
            w_shift += pp[3];
            pp += 4;
            p0 += A_hstep * 4;
        }
        if (max_kk >= 4)
        {
            ((int*)pp)[0] = w_shift * 127;
            pp += 4;
        }
#endif // __AVXVNNIINT8__
#endif // __AVX512VNNI__ || __AVXVNNI__
        for (; kk < max_kk; kk++)
        {
            pp[0] = p0[0];
            pp += 1;
            p0 += A_hstep;
        }
    }
}